

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simple_object_pool.h
# Opt level: O3

pointer __thiscall
Gudhi::
Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>::
construct<unsigned_int&,int&,Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*&>
          (Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
           *this,uint *u,int *u_1,Persistent_cohomology_column<unsigned_int,_int> **u_2)

{
  uint uVar1;
  int iVar2;
  Column *pCVar3;
  void *ret;
  pointer pPVar4;
  
  pPVar4 = *(pointer *)this;
  if (pPVar4 == (pointer)0x0) {
    pPVar4 = (pointer)boost::pool<boost::default_user_allocator_malloc_free>::malloc_need_resize
                                ((pool<boost::default_user_allocator_malloc_free> *)this);
    if (pPVar4 == (pointer)0x0) {
      __assert_fail("p",
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/common/include/gudhi/Simple_object_pool.h"
                    ,0x33,
                    "pointer Gudhi::Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned int, int>>::construct(U &&...) [T = Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned int, int>, U = <unsigned int &, int &, Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned int, int> *&>]"
                   );
    }
  }
  else {
    *(node_ptr *)this =
         (pPVar4->super_base_hook_cam_h).super_type.super_type.super_list_node<void_*>.next_;
  }
  uVar1 = *u;
  iVar2 = *u_1;
  pCVar3 = *u_2;
  (pPVar4->super_base_hook_cam_h).super_type.super_type.super_list_node<void_*>.next_ =
       (node_ptr)0x0;
  (pPVar4->super_base_hook_cam_h).super_type.super_type.super_list_node<void_*>.prev_ =
       (node_ptr)0x0;
  pPVar4->key_ = uVar1;
  pPVar4->coefficient_ = iVar2;
  pPVar4->self_col_ = pCVar3;
  return pPVar4;
}

Assistant:

pointer construct(U&&...u) {
    void* p = base().malloc BOOST_PREVENT_MACRO_SUBSTITUTION();
    assert(p);
    try {
      new(p) T(std::forward<U>(u)...);
    }    catch (...) {
      base().free BOOST_PREVENT_MACRO_SUBSTITUTION(p);
      throw;
    }
    return static_cast<pointer> (p);
  }